

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  long lVar1;
  RtreeSearchPoint *pRVar2;
  int iVar3;
  RtreeSearchPoint *pRVar4;
  uint i;
  uint j;
  
  j = pCur->nPoint;
  if ((int)j < pCur->nPointAlloc) {
    pRVar4 = pCur->aPoint;
  }
  else {
    lVar1 = (long)pCur->nPointAlloc * 2 + 8;
    pRVar4 = (RtreeSearchPoint *)sqlite3_realloc64(pCur->aPoint,lVar1 * 0x18);
    if (pRVar4 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    pCur->aPoint = pRVar4;
    pCur->nPointAlloc = (int)lVar1;
    j = pCur->nPoint;
  }
  pCur->nPoint = j + 1;
  pRVar4[(int)j].rScore = rScore;
  pRVar4[(int)j].iLevel = iLevel;
  pRVar4 = pRVar4 + (int)j;
  while( true ) {
    if ((int)j < 1) {
      return pRVar4;
    }
    i = j - 1 >> 1;
    pRVar2 = pCur->aPoint;
    iVar3 = rtreeSearchPointCompare(pRVar4,pRVar2 + i);
    if (-1 < iVar3) break;
    rtreeSearchPointSwap(pCur,i,j);
    pRVar4 = pRVar2 + i;
    j = i;
  }
  return pRVar4;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc64(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}